

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

string * __thiscall
wabt::(anonymous_namespace)::CWriter::Mangle_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view name,bool double_underscores)

{
  bool bVar1;
  CWriter *pCVar2;
  CWriter ch;
  CWriter *pCVar3;
  bool bVar4;
  bool bVar5;
  bool last_was_underscore;
  State state;
  undefined4 local_6c;
  string *local_68;
  CWriter *local_60;
  anon_class_16_2_9228a5e7 append_verbatim;
  anon_class_24_3_c371f76a append_escaped;
  
  local_6c = name._M_str._0_4_;
  append_escaped.state = &state;
  state = Any;
  pCVar2 = (CWriter *)0x0;
  append_verbatim.last_was_underscore = &last_was_underscore;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  last_was_underscore = false;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pCVar3 = this + -1;
  local_68 = __return_storage_ptr__;
  local_60 = pCVar3;
  append_verbatim.result = __return_storage_ptr__;
  append_escaped.result = __return_storage_ptr__;
  append_escaped.last_was_underscore = append_verbatim.last_was_underscore;
  do {
    if (this == pCVar2) {
      return local_68;
    }
    ch = pCVar2[name._M_len];
    switch(state) {
    case Any:
      state = (State)(ch == (CWriter)0x30);
      break;
    case Zero:
      state = (uint)(ch == (CWriter)0x78) * 2;
      break;
    case ZeroX:
      bVar4 = (byte)((char)ch - 0x30U) < 10;
      bVar5 = (byte)((char)ch + 0xbfU) < 6;
      bVar1 = bVar5 || bVar4;
      state = (uint)bVar1 + (uint)bVar1 * 2;
      if (!bVar5 && !bVar4) break;
      goto LAB_0019049a;
    case ZeroXHexDigit:
      abort();
    }
    if (ch == (CWriter)0x5f) {
      if ((pCVar3 != pCVar2 && pCVar2 != (CWriter *)0x0) && (last_was_underscore != true)) {
        if ((char)local_6c == '\0') goto LAB_00190483;
        anon_unknown_0::CWriter::Mangle::anon_class_16_2_9228a5e7::operator()(&append_verbatim,'_');
        ch = (CWriter)0x5f;
        pCVar3 = local_60;
        goto LAB_001904a6;
      }
      ch = (CWriter)0x5f;
LAB_0019049a:
      anon_unknown_0::CWriter::Mangle::anon_class_24_3_c371f76a::operator()
                (&append_escaped,(uint8_t)ch);
    }
    else {
LAB_00190483:
      if (((ch != (CWriter)0x5f) && (9 < (byte)((char)ch - 0x30U))) &&
         (0x19 < (byte)(((byte)ch & 0xdf) + 0xbf))) goto LAB_0019049a;
LAB_001904a6:
      anon_unknown_0::CWriter::Mangle::anon_class_16_2_9228a5e7::operator()
                (&append_verbatim,(uint8_t)ch);
    }
    pCVar2 = pCVar2 + 1;
  } while( true );
}

Assistant:

std::string CWriter::Mangle(std::string_view name, bool double_underscores) {
  /*
   * Name mangling transforms arbitrary Wasm names into "safe" C names
   * in a deterministic way. To avoid collisions, distinct Wasm names must be
   * transformed into distinct C names.
   *
   * The rules implemented here are:
   * 1) any hex digit ('A' through 'F') that follows the sequence "0x"
   *    is escaped
   * 2) any underscore at the beginning, at the end, or following another
   *    underscore, is escaped
   * 3) if double_underscores is set, underscores are replaced with
   *    two underscores.
   * 4) otherwise, any alphanumeric character is kept as-is,
   *    and any other character is escaped
   *
   * "Escaped" means the character is represented with the sequence "0xAB",
   * where A B are hex digits ('0'-'9' or 'A'-'F') representing the character's
   * numeric value.
   *
   * Module names are mangled with double_underscores=true to prevent
   * collisions between, e.g., a module "alfa" with export
   * "bravo_charlie" vs. a module "alfa_bravo" with export "charlie".
   */

  enum State { Any, Zero, ZeroX, ZeroXHexDigit } state{Any};
  bool last_was_underscore = false;

  std::string result;
  auto append_escaped = [&](const uint8_t ch) {
    result += "0x" + StringPrintf("%02X", ch);
    last_was_underscore = false;
    state = Any;
  };

  auto append_verbatim = [&](const uint8_t ch) {
    result += ch;
    last_was_underscore = (ch == '_');
  };

  for (auto it = name.begin(); it != name.end(); ++it) {
    const uint8_t ch = *it;
    switch (state) {
      case Any:
        state = (ch == '0') ? Zero : Any;
        break;
      case Zero:
        state = (ch == 'x') ? ZeroX : Any;
        break;
      case ZeroX:
        state = internal_ishexdigit(ch) ? ZeroXHexDigit : Any;
        break;
      case ZeroXHexDigit:
        WABT_UNREACHABLE;
        break;
    }

    /* rule 1 */
    if (state == ZeroXHexDigit) {
      append_escaped(ch);
      continue;
    }

    /* rule 2 */
    if ((ch == '_') && ((it == name.begin()) || (std::next(it) == name.end()) ||
                        last_was_underscore)) {
      append_escaped(ch);
      continue;
    }

    /* rule 3 */
    if (double_underscores && ch == '_') {
      append_verbatim(ch);
      append_verbatim(ch);
      continue;
    }

    /* rule 4 */
    if (internal_isalnum(ch) || (ch == '_')) {
      append_verbatim(ch);
    } else {
      append_escaped(ch);
    }
  }

  return result;
}